

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O0

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doEndScope(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  bool bVar1;
  reference this;
  value_type_conflict2 *pvVar2;
  reference local_68;
  reference local_58;
  uint local_44;
  undefined1 auStack_40 [4];
  value_type_conflict2 index;
  Iterator __end2;
  Iterator __begin2;
  value_type *__range2;
  Expression **currp_local;
  Scanner *self_local;
  
  this = std::
         vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
         ::back(&self->cleanupStack);
  join_0x00000010_0x00000000_ =
       (IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
        )SmallVector<unsigned_int,_5UL>::begin(this);
  _auStack_40 = (IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                 )SmallVector<unsigned_int,_5UL>::end(this);
  while( true ) {
    bVar1 = SmallVector<unsigned_int,_5UL>::
            IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
            ::operator!=((IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                          *)&__end2.
                             super_IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                             .index,(Iterator *)auStack_40);
    if (!bVar1) {
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::pop_back(&self->cleanupStack);
      return;
    }
    pvVar2 = SmallVector<unsigned_int,_5UL>::Iterator::operator*
                       ((Iterator *)
                        &__end2.
                         super_IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                         .index);
    local_44 = *pvVar2;
    local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&self->localsSet,(ulong)local_44);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
    if (!bVar1) break;
    local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&self->localsSet,(ulong)local_44);
    std::_Bit_reference::operator=(&local_68,false);
    SmallVector<unsigned_int,_5UL>::
    IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
    ::operator++((IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                  *)&__end2.
                     super_IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
                     .index);
  }
  __assert_fail("self->localsSet[index]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                ,0x6f,
                "static void wasm::LocalStructuralDominance::LocalStructuralDominance(Function *, Module &, Mode)::Scanner::doEndScope(Scanner *, Expression **)"
               );
}

Assistant:

static void doEndScope(Scanner* self, Expression** currp) {
      for (auto index : self->cleanupStack.back()) {
        assert(self->localsSet[index]);
        self->localsSet[index] = false;
      }
      self->cleanupStack.pop_back();
    }